

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::GenerateCxxModuleConfigInformation
          (cmExportBuildFileGenerator *this,ostream *os)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  char *pcVar4;
  string c;
  string local_50 [8];
  long local_48;
  
  pbVar3 = (this->super_cmExportFileGenerator).Configurations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmExportFileGenerator).Configurations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar4 = "";
  if (0x20 < (ulong)((long)pbVar1 - (long)pbVar3)) {
    pcVar4 = " OPTIONAL";
  }
  for (; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string(local_50,(string *)pbVar3);
    if (local_48 == 0) {
      std::__cxx11::string::assign((char *)local_50);
    }
    poVar2 = std::operator<<(os,"include(\"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-");
    poVar2 = std::operator<<(poVar2,local_50);
    poVar2 = std::operator<<(poVar2,".cmake\"");
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateCxxModuleConfigInformation(
  std::ostream& os) const
{
  const char* opt = "";
  if (this->Configurations.size() > 1) {
    // With more than one configuration, each individual file is optional.
    opt = " OPTIONAL";
  }

  // Generate import file content for each configuration.
  for (std::string c : this->Configurations) {
    if (c.empty()) {
      c = "noconfig";
    }
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-" << c << ".cmake\""
       << opt << ")\n";
  }
}